

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PointerPrinter::PrintValue<std::__cxx11::string_const>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p,ostream *os)

{
  ostream *os_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_local;
  
  if (p == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::ostream::operator<<(os,p);
  }
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is not a function type.  We just call << to print p,
      // relying on ADL to pick up user-defined << for their pointer
      // types, if any.
      *os << p;
    }
  }